

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

bool ON_IsConicEquationAnEllipse
               (double *conic,ON_2dPoint *center,ON_2dVector *major_axis,ON_2dVector *minor_axis,
               double *major_radius,double *minor_radius)

{
  undefined1 auVar1 [16];
  undefined4 in_EAX;
  undefined4 extraout_EAX;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined8 local_88;
  undefined8 uStack_80;
  
  dVar3 = *conic;
  if (ABS(dVar3) < 1.23432101234321e+308) {
    dVar6 = ABS(conic[1]);
    if (dVar6 < 1.23432101234321e+308) {
      dVar5 = conic[2];
      if ((((ABS(dVar5) < 1.23432101234321e+308) &&
           (dVar9 = conic[3], ABS(dVar9) < 1.23432101234321e+308)) &&
          (dVar11 = conic[4], ABS(dVar11) < 1.23432101234321e+308)) &&
         (ABS(conic[5]) < 1.23432101234321e+308)) {
        if (dVar6 <= ABS(ABS(dVar5) + dVar3) * 1e-14) {
          uVar7 = 0;
          uVar8 = 0x3ff00000;
          uStack_80._0_4_ = 0;
          uStack_80._4_4_ = 0;
          dVar6 = 0.0;
        }
        else {
          dVar3 = atan2(conic[1],dVar3 - dVar5);
          dVar10 = sin(dVar3 * 0.5);
          dVar11 = cos(dVar3 * 0.5);
          uVar7 = SUB84(dVar11,0);
          uVar8 = (undefined4)((ulong)dVar11 >> 0x20);
          dVar6 = -dVar10;
          dVar5 = conic[1] * dVar11 * dVar10;
          dVar3 = conic[2] * dVar10 * dVar10 + *conic * dVar11 * dVar11 + dVar5;
          dVar5 = conic[2] * dVar11 * dVar11 + *conic * dVar10 * dVar10 + -dVar5;
          dVar9 = dVar11 * conic[3] + conic[4] * dVar10;
          dVar11 = dVar11 * conic[4] + -conic[3] * dVar10;
          uStack_80._0_4_ = SUB84(dVar10,0);
          uStack_80._4_4_ = (undefined4)((ulong)dVar10 >> 0x20);
          in_EAX = extraout_EAX;
        }
        if (((0.0 < dVar3) && (0.0 < dVar5)) ||
           (auVar1._8_8_ = -(ulong)(dVar5 < 0.0), auVar1._0_8_ = -(ulong)(dVar3 < 0.0),
           iVar2 = movmskpd(in_EAX,auVar1), iVar2 == 3)) {
          dVar9 = (dVar9 * -0.5) / dVar3;
          dVar10 = (dVar11 * -0.5) / dVar5;
          dVar11 = conic[5] - (dVar3 * dVar9 * dVar9 + dVar5 * dVar10 * dVar10);
          if ((dVar11 != 0.0) || (NAN(dVar11))) {
            dVar3 = -dVar11 / dVar3;
            local_88 = (double)CONCAT44(uVar8,uVar7);
            if (dVar3 < 0.0) {
              dVar3 = sqrt(dVar3);
            }
            else {
              dVar3 = SQRT(dVar3);
            }
            dVar5 = -dVar11 / dVar5;
            if (dVar5 < 0.0) {
              dVar5 = sqrt(dVar5);
            }
            else {
              dVar5 = SQRT(dVar5);
            }
            dVar11 = dVar3;
            if ((dVar3 != dVar5) || (NAN(dVar3) || NAN(dVar5))) {
              if (dVar5 < dVar3) {
                major_axis->x = local_88;
                major_axis->y = uStack_80;
                minor_axis->x = dVar6;
                dVar4 = local_88;
              }
              else {
                if (dVar5 <= dVar3) {
                  return false;
                }
                major_axis->x = dVar6;
                major_axis->y = local_88;
                minor_axis->x = -local_88;
                dVar4 = -uStack_80;
                dVar11 = dVar5;
                dVar5 = dVar3;
              }
            }
            else {
              major_axis->x = 1.0;
              major_axis->y = 0.0;
              minor_axis->x = 0.0;
              dVar4 = 1.0;
            }
            minor_axis->y = dVar4;
            *major_radius = dVar11;
            *minor_radius = dVar5;
            center->x = dVar9 * local_88 + dVar10 * dVar6;
            center->y = dVar9 * uStack_80 + dVar10 * local_88;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_IsConicEquationAnEllipse( 
        const double conic[6], 
        ON_2dPoint& center, 
        ON_2dVector& major_axis, 
        ON_2dVector& minor_axis, 
        double* major_radius, 
        double* minor_radius
        )
{
  double A, C, D, E, F, x0, y0;
  double X[2], Y[2], P[2];

  if (    !ON_IsValid(conic[0]) 
       || !ON_IsValid(conic[1]) 
       || !ON_IsValid(conic[2]) 
       || !ON_IsValid(conic[3]) 
       || !ON_IsValid(conic[4]) 
       || !ON_IsValid(conic[5]) 
     )
  {
    return false;
  }

  if ( fabs(conic[1]) > 1.0e-14*fabs(conic[0]+fabs(conic[2])) ) 
  {
    // "B" is non zero - remove "rotation" from conic equation
    const double alpha = 0.5*atan2(conic[1],conic[0]-conic[2]);
    const double s = sin(alpha);
    const double c = cos(alpha);
    X[0] =  c; X[1] = s;
    Y[0] = -s; Y[1] = c;

    A = conic[0]*c*c + conic[1]*c*s + conic[2]*s*s;
    // B = conic[1]*(c*c-s*s) + 2.0*(conic[2]-conic[0])*s*c; // (B = 0)
    C = conic[0]*s*s - conic[1]*c*s + conic[2]*c*c;
    D = conic[3]*c + conic[4]*s;
    E = conic[4]*c - conic[3]*s;
    // F = conic[5]; // F not changed by rotation
  }
  else
  {
    A = conic[0];
    // B = conic[1];
    C = conic[2];
    D = conic[3];
    E = conic[4];
    // F = conic[5]; 
    X[0] = 1.0; X[1] = 0.0;
    Y[0] = 0.0; Y[1] = 1.0;
  }

  F = conic[5];

  // the if (!(...)) insures we exit if A or C is a NaN
  if ( !((A > 0.0 && C > 0.0) || (A < 0.0 && C < 0.0)) )
    return false; // conic is not an ellipse 

  // set P = center
  x0 = -0.5*D/A;
  y0 = -0.5*E/C;
  P[0] = x0*X[0] + y0*Y[0];
  P[1] = x0*X[1] + y0*Y[1];

  // set A and C to ellipse axes lengths
  F = conic[5] -(A*x0*x0 + C*y0*y0);
  if ( !(0.0 != F) )
    return false; // F is 0.0 or a NaN

  // We know A and C have the same sign and F has the opposite sign.
  A = sqrt(-F/A);
  C = sqrt(-F/C);

  if ( A == C )
  {
    // circle
    major_axis.x = 1.0;
    major_axis.y = 0.0;
    minor_axis.x = 0.0;
    minor_axis.y = 1.0;
    *major_radius = A;
    *minor_radius = C;
  }
  else if ( A > C )
  {
    // X = major axis, Y = minor axis
    major_axis.x = X[0];
    major_axis.y = X[1];
    minor_axis.x = Y[0];
    minor_axis.y = Y[1];
    *major_radius = A;
    *minor_radius = C;
  }
  else if ( C > A )
  {
    // Y = major axis, -X = minor axis
    major_axis.x = Y[0];
    major_axis.y = Y[1];
    minor_axis.x = -X[0];
    minor_axis.y = -X[1];
    *major_radius = C;
    *minor_radius = A;
  }
  else
  {
    // A or C is a NaN
    return false;
  }

  center.x = P[0];
  center.y = P[1];

  return true;
}